

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O1

void __thiscall
amrex::DeriveList::add
          (DeriveList *this,string *name,IndexType res_typ,int nvar_der,
          Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vars,DeriveFuncFab *der_func_fab,DeriveBoxMap bx_map,Interpolater *interp)

{
  size_t *psVar1;
  _Node *p_Var2;
  _Any_data local_f0;
  code *local_e0;
  DeriveRec local_d0;
  
  std::
  function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
  ::function((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
              *)&local_f0,der_func_fab);
  DeriveRec::DeriveRec
            (&local_d0,name,res_typ,nvar_der,vars,(DeriveFuncFab *)&local_f0,bx_map,interp);
  p_Var2 = std::__cxx11::list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>::
           _M_create_node<amrex::DeriveRec>(&this->lst,&local_d0);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  psVar1 = &(this->lst).super__List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  DeriveRec::~DeriveRec(&local_d0);
  if (local_e0 != (code *)0x0) {
    (*local_e0)(&local_f0,&local_f0,__destroy_functor);
  }
  return;
}

Assistant:

void
DeriveList::add (const std::string&      name,
                 IndexType               res_typ,
                 int                     nvar_der,
                 Vector<std::string> const&    vars,
                 DeriveFuncFab           der_func_fab,
                 DeriveRec::DeriveBoxMap bx_map,
                 Interpolater*           interp)
{
    lst.push_back(DeriveRec(name,res_typ,nvar_der,vars,der_func_fab,bx_map,interp));
}